

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void __thiscall dnet::data_types::matrix::matrix(matrix *this,double def,axes_type *size)

{
  double local_8;
  
  local_8 = def;
  tensor<double,_2U>::tensor
            (&this->super_tensor<double,_2U>,&local_8,(array<unsigned_int,_2UL>)*&size->_M_elems);
  return;
}

Assistant:

matrix::matrix(double def, const axes_type &size) : tensor(def, size) {}